

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_process_function
          (t_java_generator *this,t_service *tservice,t_function *tfunction)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  ostream *poVar4;
  t_struct *ptVar5;
  size_type sVar6;
  t_type *ptVar7;
  reference pptVar8;
  char *pcVar9;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1f8
  ;
  t_field **local_1f0;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  string local_1a0;
  allocator local_179;
  string local_178;
  string local_158;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_138
  ;
  t_field **local_130;
  byte local_121;
  undefined1 local_120 [7];
  bool first;
  string local_100;
  string local_e0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_c0;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *arg_struct;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_88;
  const_iterator x_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *xceptions;
  t_struct *xs;
  undefined1 local_60 [8];
  string resultname;
  string argsname;
  t_function *tfunction_local;
  t_service *tservice_local;
  t_java_generator *this_local;
  
  psVar3 = t_function::get_name_abi_cxx11_(tfunction);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&resultname.field_2 + 8),psVar3,"_args");
  psVar3 = t_function::get_name_abi_cxx11_(tfunction);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 psVar3,"_result");
  bVar1 = t_function::is_oneway(tfunction);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)local_60,"org.apache.thrift.TBase");
  }
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"public static class ");
  psVar3 = t_function::get_name_abi_cxx11_(tfunction);
  poVar4 = std::operator<<(poVar4,(string *)psVar3);
  poVar4 = std::operator<<(poVar4,"<I extends Iface> extends org.apache.thrift.ProcessFunction<I, ")
  ;
  poVar4 = std::operator<<(poVar4,(string *)(resultname.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4,"> {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"public ");
  psVar3 = t_function::get_name_abi_cxx11_(tfunction);
  poVar4 = std::operator<<(poVar4,(string *)psVar3);
  poVar4 = std::operator<<(poVar4,"() {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"  super(\"");
  psVar3 = t_function::get_name_abi_cxx11_(tfunction);
  poVar4 = std::operator<<(poVar4,(string *)psVar3);
  poVar4 = std::operator<<(poVar4,"\");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"public ");
  poVar4 = std::operator<<(poVar4,(string *)(resultname.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4," getEmptyArgsInstance() {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"  return new ");
  poVar4 = std::operator<<(poVar4,(string *)(resultname.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4,"();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"protected boolean isOneway() {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"  return ");
  bVar1 = t_function::is_oneway(tfunction);
  pcVar9 = "false";
  if (bVar1) {
    pcVar9 = "true";
  }
  poVar4 = std::operator<<(poVar4,pcVar9);
  poVar4 = std::operator<<(poVar4,";");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"@Override");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"protected boolean rethrowUnhandledExceptions() {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"  return ");
  pcVar9 = "false";
  if ((this->rethrow_unhandled_exceptions_ & 1U) != 0) {
    pcVar9 = "true";
  }
  poVar4 = std::operator<<(poVar4,pcVar9);
  poVar4 = std::operator<<(poVar4,";");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  poVar4 = std::operator<<(poVar4,"public ");
  poVar4 = std::operator<<(poVar4,(string *)local_60);
  poVar4 = std::operator<<(poVar4," getResult(I iface, ");
  poVar4 = std::operator<<(poVar4,(string *)(resultname.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4," args) throws org.apache.thrift.TException {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  bVar1 = t_function::is_oneway(tfunction);
  if (!bVar1) {
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,(string *)local_60);
    poVar4 = std::operator<<(poVar4," result = new ");
    poVar4 = std::operator<<(poVar4,(string *)local_60);
    poVar4 = std::operator<<(poVar4,"();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  ptVar5 = t_function::get_xceptions(tfunction);
  x_iter._M_current = (t_field **)t_struct::get_members(ptVar5);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_88);
  sVar6 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)x_iter._M_current);
  if (sVar6 != 0) {
    t_generator::indent_abi_cxx11_((string *)&arg_struct,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&arg_struct);
    poVar4 = std::operator<<(poVar4,"try {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&arg_struct);
    t_generator::indent_up((t_generator *)this);
  }
  ptVar5 = t_function::get_arglist(tfunction);
  f_iter._M_current = (t_field **)t_struct::get_members(ptVar5);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_c0);
  t_generator::indent_abi_cxx11_(&local_e0,(t_generator *)this);
  std::operator<<((ostream *)&this->f_service_,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  bVar1 = t_function::is_oneway(tfunction);
  if (!bVar1) {
    ptVar7 = t_function::get_returntype(tfunction);
    uVar2 = (*(ptVar7->super_t_doc)._vptr_t_doc[4])();
    if ((uVar2 & 1) == 0) {
      std::operator<<((ostream *)&this->f_service_,"result.success = ");
    }
  }
  poVar4 = std::operator<<((ostream *)&this->f_service_,"iface.");
  psVar3 = t_function::get_name_abi_cxx11_(tfunction);
  std::__cxx11::string::string((string *)local_120,(string *)psVar3);
  get_rpc_method_name(&local_100,this,(string *)local_120);
  poVar4 = std::operator<<(poVar4,(string *)&local_100);
  std::operator<<(poVar4,"(");
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)local_120);
  local_121 = 1;
  local_130 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_c0._M_current = local_130;
  while( true ) {
    local_138._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_c0,&local_138);
    if (!bVar1) break;
    if ((local_121 & 1) == 0) {
      std::operator<<((ostream *)&this->f_service_,", ");
    }
    else {
      local_121 = 0;
    }
    poVar4 = std::operator<<((ostream *)&this->f_service_,"args.");
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_c0);
    psVar3 = t_field::get_name_abi_cxx11_(*pptVar8);
    std::operator<<(poVar4,(string *)psVar3);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_c0);
  }
  poVar4 = std::operator<<((ostream *)&this->f_service_,");");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  bVar1 = t_function::is_oneway(tfunction);
  if (!bVar1) {
    ptVar7 = t_function::get_returntype(tfunction);
    uVar2 = (*(ptVar7->super_t_doc)._vptr_t_doc[4])();
    if ((uVar2 & 1) == 0) {
      ptVar7 = t_function::get_returntype(tfunction);
      bVar1 = type_can_be_null(this,ptVar7);
      if (!bVar1) {
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
        poVar4 = std::operator<<(poVar4,"result.set");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_178,"success",&local_179);
        get_cap_name(&local_158,this,&local_178);
        poVar4 = std::operator<<(poVar4,(string *)&local_158);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1c0,"isSet",&local_1c1);
        get_cap_name(&local_1a0,this,&local_1c0);
        poVar4 = std::operator<<(poVar4,(string *)&local_1a0);
        poVar4 = std::operator<<(poVar4,"(true);");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_178);
        std::allocator<char>::~allocator((allocator<char> *)&local_179);
      }
    }
  }
  bVar1 = t_function::is_oneway(tfunction);
  if ((!bVar1) &&
     (sVar6 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size
                        ((vector<t_field_*,_std::allocator<t_field_*>_> *)x_iter._M_current),
     sVar6 != 0)) {
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
    poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_1e8);
    std::operator<<(poVar4,"}");
    std::__cxx11::string::~string((string *)&local_1e8);
    local_1f0 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(x_iter._M_current);
    local_88._M_current = local_1f0;
    while( true ) {
      local_1f8._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(x_iter._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_88,&local_1f8);
      if (!bVar1) break;
      poVar4 = std::operator<<((ostream *)&this->f_service_," catch (");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_88);
      ptVar7 = t_field::get_type(*pptVar8);
      type_name_abi_cxx11_(&local_218,this,ptVar7,false,false,false,false);
      poVar4 = std::operator<<(poVar4,(string *)&local_218);
      poVar4 = std::operator<<(poVar4," ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_88);
      psVar3 = t_field::get_name_abi_cxx11_(*pptVar8);
      poVar4 = std::operator<<(poVar4,(string *)psVar3);
      poVar4 = std::operator<<(poVar4,") {");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_218);
      bVar1 = t_function::is_oneway(tfunction);
      if (bVar1) {
        std::operator<<((ostream *)&this->f_service_,"}");
      }
      else {
        t_generator::indent_up((t_generator *)this);
        t_generator::indent_abi_cxx11_(&local_238,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_238);
        poVar4 = std::operator<<(poVar4,"result.");
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_88);
        psVar3 = t_field::get_name_abi_cxx11_(*pptVar8);
        poVar4 = std::operator<<(poVar4,(string *)psVar3);
        poVar4 = std::operator<<(poVar4," = ");
        pptVar8 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_88);
        psVar3 = t_field::get_name_abi_cxx11_(*pptVar8);
        poVar4 = std::operator<<(poVar4,(string *)psVar3);
        poVar4 = std::operator<<(poVar4,";");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_238);
        t_generator::indent_down((t_generator *)this);
        t_generator::indent_abi_cxx11_(&local_258,(t_generator *)this);
        poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_258);
        std::operator<<(poVar4,"}");
        std::__cxx11::string::~string((string *)&local_258);
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_88);
    }
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  }
  bVar1 = t_function::is_oneway(tfunction);
  if (bVar1) {
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"return null;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    poVar4 = std::operator<<(poVar4,"return result;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  t_generator::indent_down((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
  std::operator<<(poVar4,"}");
  std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
  poVar4 = std::operator<<((ostream *)&this->f_service_,(string *)&local_278);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(resultname.field_2._M_local_buf + 8));
  return;
}

Assistant:

void t_java_generator::generate_process_function(t_service* tservice, t_function* tfunction) {
  string argsname = tfunction->get_name() + "_args";
  string resultname = tfunction->get_name() + "_result";
  if (tfunction->is_oneway()) {
    resultname = "org.apache.thrift.TBase";
  }

  (void)tservice;
  // Open class
  indent(f_service_) << "public static class " << tfunction->get_name()
                     << "<I extends Iface> extends org.apache.thrift.ProcessFunction<I, "
                     << argsname << "> {" << endl;
  indent_up();

  indent(f_service_) << "public " << tfunction->get_name() << "() {" << endl;
  indent(f_service_) << "  super(\"" << tfunction->get_name() << "\");" << endl;
  indent(f_service_) << "}" << endl << endl;

  indent(f_service_) << "public " << argsname << " getEmptyArgsInstance() {" << endl;
  indent(f_service_) << "  return new " << argsname << "();" << endl;
  indent(f_service_) << "}" << endl << endl;

  indent(f_service_) << "protected boolean isOneway() {" << endl;
  indent(f_service_) << "  return " << ((tfunction->is_oneway()) ? "true" : "false") << ";" << endl;
  indent(f_service_) << "}" << endl << endl;

  indent(f_service_) << "@Override" << endl;
  indent(f_service_) << "protected boolean rethrowUnhandledExceptions() {" << endl;
  indent(f_service_) << "  return " << ((rethrow_unhandled_exceptions_) ? "true" : "false") << ";" << endl;
  indent(f_service_) << "}" << endl << endl;

  indent(f_service_) << "public " << resultname << " getResult(I iface, " << argsname
                     << " args) throws org.apache.thrift.TException {" << endl;
  indent_up();
  if (!tfunction->is_oneway()) {
    indent(f_service_) << resultname << " result = new " << resultname << "();" << endl;
  }

  t_struct* xs = tfunction->get_xceptions();
  const std::vector<t_field*>& xceptions = xs->get_members();
  vector<t_field*>::const_iterator x_iter;

  // Try block for a function with exceptions
  if (xceptions.size() > 0) {
    f_service_ << indent() << "try {" << endl;
    indent_up();
  }

  // Generate the function call
  t_struct* arg_struct = tfunction->get_arglist();
  const std::vector<t_field*>& fields = arg_struct->get_members();
  vector<t_field*>::const_iterator f_iter;
  f_service_ << indent();

  if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()) {
    f_service_ << "result.success = ";
  }
  f_service_ << "iface." << get_rpc_method_name(tfunction->get_name()) << "(";
  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      f_service_ << ", ";
    }
    f_service_ << "args." << (*f_iter)->get_name();
  }
  f_service_ << ");" << endl;

  // Set isset on success field
  if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()
      && !type_can_be_null(tfunction->get_returntype())) {
    indent(f_service_) << "result.set" << get_cap_name("success") << get_cap_name("isSet")
                       << "(true);" << endl;
  }

  if (!tfunction->is_oneway() && xceptions.size() > 0) {
    indent_down();
    f_service_ << indent() << "}";
    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      f_service_ << " catch (" << type_name((*x_iter)->get_type(), false, false) << " "
                 << (*x_iter)->get_name() << ") {" << endl;
      if (!tfunction->is_oneway()) {
        indent_up();
        f_service_ << indent() << "result." << (*x_iter)->get_name() << " = "
                   << (*x_iter)->get_name() << ";" << endl;
        indent_down();
        f_service_ << indent() << "}";
      } else {
        f_service_ << "}";
      }
    }
    f_service_ << endl;
  }

  if (tfunction->is_oneway()) {
    indent(f_service_) << "return null;" << endl;
  } else {
    indent(f_service_) << "return result;" << endl;
  }
  indent_down();
  indent(f_service_) << "}";

  // Close function
  f_service_ << endl;

  // Close class
  indent_down();
  f_service_ << indent() << "}" << endl << endl;
}